

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nalUnits.cpp
# Opt level: O0

void SEIUnit::updateMetadataPts(uint8_t *metadataPtsPtr,int64_t pts)

{
  ushort uVar1;
  uint16_t val;
  int64_t pts_local;
  uint8_t *metadataPtsPtr_local;
  
  *metadataPtsPtr = (byte)(pts >> 0x1e) & 7;
  uVar1 = (ushort)(pts >> 0xf) & 0x7fff;
  metadataPtsPtr[1] = (char)(uVar1 >> 8) + 0x80;
  metadataPtsPtr[2] = (uint8_t)uVar1;
  uVar1 = (ushort)pts & 0x7fff;
  metadataPtsPtr[3] = (char)(uVar1 >> 8) + 0x80;
  metadataPtsPtr[4] = (uint8_t)uVar1;
  return;
}

Assistant:

void SEIUnit::updateMetadataPts(uint8_t* metadataPtsPtr, const int64_t pts)
{
    metadataPtsPtr[0] = (pts >> 30) & 0x07;

    auto val = static_cast<uint16_t>((pts >> 15) & 0x7fff);
    metadataPtsPtr[1] = 0x80 + (val >> 8);
    metadataPtsPtr[2] = val & 0xff;

    val = static_cast<uint16_t>(pts & 0x7fff);
    metadataPtsPtr[3] = 0x80 + (val >> 8);
    metadataPtsPtr[4] = val & 0xff;
}